

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall Scene::changeState(Scene *this)

{
  Scene *this_local;
  
  if ((this->state != 5) && (this->state != 4)) {
    this->state = (this->state + 1) % 3;
    StateScene::setState(this->ss,this->state);
    GroundScene::setState(this->gs,this->state);
  }
  return;
}

Assistant:

void Scene::changeState(){
	if(state == STATE_OVER || state == STATE_PAUSE){
		return;
	}
	state = (state+1)%STATE_NUMBER;
	ss->setState(state);
	gs->setState(state);
}